

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.cpp
# Opt level: O0

O3DGCErrorCode o3dgc::SaveUIntData(Vector<long> *data,BinaryStream *bstream)

{
  unsigned_long position;
  unsigned_long uVar1;
  unsigned_long *puVar2;
  undefined8 local_30;
  unsigned_long i;
  unsigned_long size;
  unsigned_long start;
  BinaryStream *bstream_local;
  Vector<long> *data_local;
  
  position = BinaryStream::GetSize(bstream);
  BinaryStream::WriteUInt32ASCII(bstream,0);
  uVar1 = Vector<long>::GetSize(data);
  BinaryStream::WriteUInt32ASCII(bstream,uVar1);
  for (local_30 = 0; local_30 < uVar1; local_30 = local_30 + 1) {
    puVar2 = (unsigned_long *)Vector<long>::operator[](data,local_30);
    BinaryStream::WriteUIntASCII(bstream,*puVar2);
  }
  uVar1 = BinaryStream::GetSize(bstream);
  BinaryStream::WriteUInt32ASCII(bstream,position,uVar1 - position);
  return O3DGC_OK;
}

Assistant:

O3DGCErrorCode    SaveUIntData(const Vector<long> & data,
                                   BinaryStream & bstream) 
    {
        unsigned long start = bstream.GetSize();
        bstream.WriteUInt32ASCII(0);
        const unsigned long size       = data.GetSize();
        bstream.WriteUInt32ASCII(size);
        for(unsigned long i = 0; i < size; ++i)
        {
            bstream.WriteUIntASCII(data[i]);
        }
        bstream.WriteUInt32ASCII(start, bstream.GetSize() - start);
        return O3DGC_OK;
    }